

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsRectVisible(ImVec2 *size)

{
  bool bVar1;
  ImRect *this;
  ImGuiWindow *window;
  ImVec2 *lhs;
  ImVec2 local_28;
  ImRect local_20;
  ImGuiWindow *local_10;
  
  local_10 = GImGui->CurrentWindow;
  this = &local_10->ClipRect;
  lhs = &(local_10->DC).CursorPos;
  local_28 = operator+(lhs,(ImVec2 *)0x12b154);
  ImRect::ImRect(&local_20,lhs,&local_28);
  bVar1 = ImRect::Overlaps(this,&local_20);
  return bVar1;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& size)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(window->DC.CursorPos, window->DC.CursorPos + size));
}